

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_level_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  pvip_t *pvip_00;
  PVIPString *str;
  PVIPNode *pPVar2;
  PVIPNode *node;
  PVIPString *x;
  pvip_t *pvip;
  
  C = 0;
  printf("1..3\n");
  pvip_00 = pvip_new();
  str = PVIP_string_new();
  str->buflen = 1;
  PVIP_string_printf(str,"%d",1);
  if (str->len == 1) {
    iVar1 = memcmp(str->buf,"1",1);
    if (iVar1 != 0) goto LAB_00102318;
    printf("ok 1\n");
  }
  else {
LAB_00102318:
    printf("not ok 1\n");
    printf("# len: %ld\n",str->len);
    printf("# char[0]: %x\n",(ulong)(uint)(int)*str->buf);
  }
  PVIP_string_printf(str,"%s%d","hoge");
  if (str->len == 6) {
    iVar1 = memcmp(str->buf,"1hoge2",6);
    if (iVar1 == 0) {
      printf("ok 2\n");
      goto LAB_001023ce;
    }
  }
  printf("not ok 2\n");
  printf("# len: %ld\n",str->len);
LAB_001023ce:
  PVIP_string_destroy(str);
  pPVar2 = PVIP_parse_string(pvip_00,"\n",1,0,(PVIPString **)0x0);
  if (pPVar2 == (PVIPNode *)0x0) {
    printf("not ok 3\n");
  }
  else {
    printf("ok 3\n");
  }
  pvip_free(pvip_00);
  return 0;
}

Assistant:

int main() {
    C=0;
    printf("1..3\n");

    pvip_t* pvip = pvip_new();

    {
        PVIPString * x = PVIP_string_new();
        x->buflen = 1; // shorten buffer length for testing

        PVIP_string_printf(x, "%d", 1);
        if (x->len==1 && memcmp(x->buf, "1", 1)==0) {
            printf("ok 1\n");
        } else {
            printf("not ok 1\n");
            printf("# len: %ld\n", x->len);
            printf("# char[0]: %x\n", x->buf[0]);
        }

        PVIP_string_printf(x, "%s%d", "hoge", 2);
        if (x->len==6 && !memcmp(x->buf, "1hoge2", 6)) {
            printf("ok 2\n");
        } else {
            printf("not ok 2\n");
            printf("# len: %ld\n", x->len);
        }

        PVIP_string_destroy(x);
    }

    {
        PVIPNode *node = PVIP_parse_string(pvip, "\n", 1, 0, NULL);
        if (node) {
            printf("ok 3\n");
        } else {
            printf("not ok 3\n");
        }
    }

    pvip_free(pvip);

    return 0;
}